

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.h
# Opt level: O1

void __thiscall SAT::saveCurrentPolarities(SAT *this)

{
  char cVar1;
  char *pcVar2;
  bool *pbVar3;
  lbool lVar4;
  lbool lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  lVar5.value = ::l_False.value;
  lVar4.value = ::l_True.value;
  uVar6 = (ulong)(this->assigns).sz;
  if (uVar6 != 0) {
    pcVar2 = (this->assigns).data;
    pbVar3 = (this->polarity).data;
    uVar7 = 0;
    do {
      cVar1 = pcVar2[uVar7];
      if (lVar4.value == cVar1) {
        bVar8 = false;
LAB_001bc65e:
        pbVar3[uVar7] = bVar8;
      }
      else {
        bVar8 = true;
        if (lVar5.value == cVar1) goto LAB_001bc65e;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  return;
}

Assistant:

void saveCurrentPolarities() {
		for (unsigned int i = 0; i < assigns.size(); i++) {
			if (assigns[i] == toInt(l_True)) {
				polarity[i] = false;  // False means to branch 'true' on this SAT variable
			} else if (assigns[i] == toInt(l_False)) {
				polarity[i] = true;  // True means to branch 'false' on this SAT variable
			}
		}
	}